

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::print_typed_attr<std::__cxx11::string>
          (string *__return_storage_ptr__,tinyusdz *this,
          TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *attr,string *name,uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  tinyusdz tVar2;
  byte bVar3;
  string *psVar4;
  bool bVar5;
  bool bVar6;
  ostream *poVar7;
  long lVar8;
  uint32_t indent_00;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_01;
  size_type sVar9;
  byte bVar10;
  char *pcVar11;
  byte bVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> a;
  stringstream ss;
  string local_268;
  string *local_248;
  uint32_t local_23c;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_238;
  string *local_230;
  tinyusdz local_228;
  storage_t<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220 [32];
  byte local_200;
  char local_1ff;
  TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_248 = name;
  std::__cxx11::stringstream::stringstream(local_1b8);
  tVar2 = this[0x228];
  local_230 = __return_storage_ptr__;
  if (tVar2 == (tinyusdz)0x0) {
    name = *(string **)(this + 0x218);
    if (name != *(string **)(this + 0x210)) {
      bVar3 = 1;
      local_228 = tVar2;
      goto LAB_002264f9;
    }
    if ((this[0x208] == (tinyusdz)0x0) && (((byte)this[0x278] & 1) == 0)) goto LAB_00226a77;
    bVar10 = ((byte)this[0x278] ^ 1) & (byte)this[0x208];
    bVar3 = 0;
    local_228 = tVar2;
  }
  else {
    local_228 = tVar2;
    nonstd::optional_lite::detail::
    storage_t<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::construct_value(local_220,(value_type *)(this + 0x230));
    bVar3 = 0;
LAB_002264f9:
    bVar10 = 0;
  }
  bVar12 = local_200;
  indent_00 = (uint32_t)name;
  if (((byte)local_228 & 1) == 0) {
    bVar12 = 0;
    local_23c = 0;
  }
  else {
    if (local_1f8._dirty == true) {
      TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::update(&local_1f8);
    }
    indent_00 = (uint32_t)
                CONCAT71((int7)((ulong)local_1f8._samples.
                                       super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
                                       ._M_impl.super__Vector_impl_data._M_finish >> 8),
                         local_1f8._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_finish !=
                         local_1f8._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    local_23c = indent_00;
  }
  if (((((byte)local_228 & 1) == 0) || (local_1ff != '\0')) || (local_200 != 0)) {
    bVar6 = false;
  }
  else {
    bVar6 = local_1f8._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_1f8._samples.
            super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  }
  bVar5 = AttrMetas::authored((AttrMetas *)this);
  if (((bVar5) || (!(bool)(bVar3 | bVar6))) ||
     (n_01 = n, ((bVar10 | (byte)this[0x278] | bVar12) & 1) != 0)) {
    pprint::Indent_abi_cxx11_(&local_268,(pprint *)local_248,n);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    paVar1 = &local_268.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,
                      CONCAT17(local_268.field_2._M_local_buf[7],
                               CONCAT16(local_268.field_2._M_local_buf[6],
                                        CONCAT24(local_268.field_2._M_allocated_capacity._4_2_,
                                                 local_268.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    local_268.field_2._M_allocated_capacity._0_4_ = 0x69727473;
    local_268.field_2._M_allocated_capacity._4_2_ = 0x676e;
    local_268._M_string_length = 6;
    local_268.field_2._M_local_buf[6] = '\0';
    local_268._M_dataplus._M_p = (pointer)paVar1;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(char *)(attr->_metas).interpolation,(long)(attr->_metas).elementSize);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,
                      CONCAT17(local_268.field_2._M_local_buf[7],
                               CONCAT16(local_268.field_2._M_local_buf[6],
                                        CONCAT24(local_268.field_2._M_allocated_capacity._4_2_,
                                                 local_268.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if (this[0x278] == (tinyusdz)0x1) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = None",7);
    }
    else if (bVar12 != 0) {
      local_268._M_string_length = 0;
      local_268.field_2._M_allocated_capacity._0_4_ =
           local_268.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      local_268._M_dataplus._M_p = (pointer)paVar1;
      if (local_228 == (tinyusdz)0x0) goto LAB_00226ad0;
      if ((local_1ff == '\0') && (local_200 == 1)) {
        std::__cxx11::string::_M_assign((string *)&local_268);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
        sVar9 = local_268._M_string_length;
        pcVar11 = local_268._M_dataplus._M_p;
      }
      else {
        pcVar11 = " = [InternalError]";
        sVar9 = 0x12;
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar11,sVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != paVar1) {
        operator_delete(local_268._M_dataplus._M_p,
                        CONCAT17(local_268.field_2._M_local_buf[7],
                                 CONCAT16(local_268.field_2._M_local_buf[6],
                                          CONCAT24(local_268.field_2._M_allocated_capacity._4_2_,
                                                   local_268.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
    }
    bVar6 = AttrMetas::authored((AttrMetas *)this);
    if (bVar6) {
      local_238 = attr;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
      psVar4 = local_248;
      print_attr_metas_abi_cxx11_(&local_268,this,(AttrMeta *)(ulong)((int)local_248 + 1),indent_00)
      ;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)psVar4 & 0xffffffff),n_00);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      attr = local_238;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != paVar1) {
        operator_delete(local_268._M_dataplus._M_p,
                        CONCAT17(local_268.field_2._M_local_buf[7],
                                 CONCAT16(local_268.field_2._M_local_buf[6],
                                          CONCAT24(local_268.field_2._M_allocated_capacity._4_2_,
                                                   local_268.field_2._M_allocated_capacity._0_4_)))
                        + 1);
        attr = local_238;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX;
  }
  if ((char)local_23c != '\0') {
    pprint::Indent_abi_cxx11_(&local_268,(pprint *)local_248,n_01);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    paVar1 = &local_268.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,
                      CONCAT17(local_268.field_2._M_local_buf[7],
                               CONCAT16(local_268.field_2._M_local_buf[6],
                                        CONCAT24(local_268.field_2._M_allocated_capacity._4_2_,
                                                 local_268.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    local_268.field_2._M_allocated_capacity._0_4_ = 0x69727473;
    local_268.field_2._M_allocated_capacity._4_2_ = 0x676e;
    local_268._M_string_length = 6;
    local_268.field_2._M_local_buf[6] = '\0';
    local_268._M_dataplus._M_p = (pointer)paVar1;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(char *)(attr->_metas).interpolation,(long)(attr->_metas).elementSize);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,
                      CONCAT17(local_268.field_2._M_local_buf[7],
                               CONCAT16(local_268.field_2._M_local_buf[6],
                                        CONCAT24(local_268.field_2._M_allocated_capacity._4_2_,
                                                 local_268.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".timeSamples = ",0xf);
    if (local_228 == (tinyusdz)0x0) {
LAB_00226ad0:
      __assert_fail("has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                    ,0x584,
                    "const value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<std::basic_string<char>>>::value() const [T = tinyusdz::Animatable<std::basic_string<char>>]"
                   );
    }
    print_typed_timesamples<std::__cxx11::string>
              (&local_268,(tinyusdz *)&local_1f8,
               (TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_248,indent_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,
                      CONCAT17(local_268.field_2._M_local_buf[7],
                               CONCAT16(local_268.field_2._M_local_buf[6],
                                        CONCAT24(local_268.field_2._M_allocated_capacity._4_2_,
                                                 local_268.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    n_01 = extraout_EDX_00;
  }
  if (*(long *)(this + 0x218) != *(long *)(this + 0x210)) {
    pprint::Indent_abi_cxx11_(&local_268,(pprint *)local_248,n_01);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    paVar1 = &local_268.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,
                      CONCAT17(local_268.field_2._M_local_buf[7],
                               CONCAT16(local_268.field_2._M_local_buf[6],
                                        CONCAT24(local_268.field_2._M_allocated_capacity._4_2_,
                                                 local_268.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    local_268.field_2._M_allocated_capacity._0_4_ = 0x69727473;
    local_268.field_2._M_allocated_capacity._4_2_ = 0x676e;
    local_268._M_string_length = 6;
    local_268.field_2._M_local_buf[6] = '\0';
    local_268._M_dataplus._M_p = (pointer)paVar1;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(char *)(attr->_metas).interpolation,(long)(attr->_metas).elementSize);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,
                      CONCAT17(local_268.field_2._M_local_buf[7],
                               CONCAT16(local_268.field_2._M_local_buf[6],
                                        CONCAT24(local_268.field_2._M_allocated_capacity._4_2_,
                                                 local_268.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
    lVar8 = (*(long *)(this + 0x218) - (long)*(Path **)(this + 0x210) >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (lVar8 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
    }
    else if (lVar8 == 1) {
      std::operator<<(local_1a8,*(Path **)(this + 0x210));
    }
    else {
      std::operator<<(local_1a8,
                      (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(this + 0x210));
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  }
  if (local_228 == (tinyusdz)0x1) {
    nonstd::optional_lite::detail::
    storage_t<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::destruct_value(local_220);
  }
LAB_00226a77:
  psVar4 = local_230;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}